

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void pipe_reap(void *arg)

{
  (**(code **)((long)arg + 0x70))(*(undefined8 *)((long)arg + 0x90));
  (**(code **)((long)arg + 0x38))(*(undefined8 *)((long)arg + 0x88));
  nni_pipe_run_cb((nni_pipe *)arg,NNG_PIPE_EV_REM_POST);
  nni_mtx_lock(&pipes_lk);
  if ((ulong)*arg != 0) {
    nni_id_remove(&pipes,(ulong)*arg);
  }
  nni_mtx_unlock(&pipes_lk);
  nni_stat_unregister((nni_stat_item *)((long)arg + 0x100));
  (**(code **)((long)arg + 0x78))(*(undefined8 *)((long)arg + 0x90));
  (**(code **)((long)arg + 0x20))(*(undefined8 *)((long)arg + 0x88));
  nni_pipe_remove((nni_pipe *)arg);
  nni_refcnt_rele((nni_refcnt *)((long)arg + 0xe0));
  return;
}

Assistant:

void
pipe_reap(void *arg)
{
	nni_pipe *p = arg;

	p->p_proto_ops.pipe_close(p->p_proto_data);

	// Close the underlying transport.
	p->p_tran_ops.p_close(p->p_tran_data);

	nni_pipe_run_cb(p, NNG_PIPE_EV_REM_POST);

	// Make sure any unlocked holders are done with this.
	// This happens during initialization for example.
	nni_mtx_lock(&pipes_lk);
	if (p->p_id != 0) {
		nni_id_remove(&pipes, p->p_id);
	}
	nni_mtx_unlock(&pipes_lk);

#ifdef NNG_ENABLE_STATS
	nni_stat_unregister(&p->st_root);
#endif

	p->p_proto_ops.pipe_stop(p->p_proto_data);
	p->p_tran_ops.p_stop(p->p_tran_data);

	nni_pipe_remove(p);

	nni_pipe_rele(p);
}